

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinputdevice.h
# Opt level: O1

void __thiscall
UinputDevice::UinputDevice
          (UinputDevice *this,string *path,uint bus,string *name,uint vendor,uint product,
          uint version,
          vector<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_>
          *possibleEvents,
          vector<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
          *absoluteAxesCalibrationData)

{
  uint uVar1;
  uint uVar2;
  pointer pAVar3;
  pointer pPVar4;
  uint *puVar5;
  bool bVar6;
  int iVar7;
  AbsoluteAxisCalibrationData *aacd;
  pointer pAVar8;
  ssize_t sVar9;
  ostream *poVar10;
  long *plVar11;
  uint *puVar12;
  ulong __request;
  PossibleEvent *pe;
  pointer pPVar13;
  char local_48c [80];
  undefined2 local_43c;
  undefined2 local_43a;
  undefined2 local_438;
  undefined2 local_436;
  int aiStack_430 [64];
  int aiStack_330 [64];
  int aiStack_230 [64];
  int aiStack_130 [64];
  
  this->_fd = 0;
  destroy(this);
  iVar7 = ::open((path->_M_dataplus)._M_p,0x801);
  this->_fd = iVar7;
  if (iVar7 != 0) {
    memset(local_48c,0,0x45c);
    strncpy(local_48c,(name->_M_dataplus)._M_p,0x50);
    local_43c = (undefined2)bus;
    local_438 = (undefined2)product;
    local_43a = (undefined2)vendor;
    local_436 = (undefined2)version;
    pAVar3 = (absoluteAxesCalibrationData->
             super__Vector_base<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pAVar8 = (absoluteAxesCalibrationData->
                  super__Vector_base<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
                  )._M_impl.super__Vector_impl_data._M_start; pAVar8 != pAVar3; pAVar8 = pAVar8 + 1)
    {
      aiStack_330[pAVar8->axis] = pAVar8->min;
      aiStack_430[pAVar8->axis] = pAVar8->max;
      aiStack_230[pAVar8->axis] = pAVar8->fuzz;
      aiStack_130[pAVar8->axis] = pAVar8->flat;
    }
    sVar9 = write(iVar7,local_48c,0x45c);
    if (sVar9 == 0x45c) {
      pPVar4 = (possibleEvents->
               super__Vector_base<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pPVar13 = (possibleEvents->
                     super__Vector_base<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_>
                     )._M_impl.super__Vector_impl_data._M_start; pPVar13 != pPVar4;
          pPVar13 = pPVar13 + 1) {
        iVar7 = ioctl(this->_fd,0x40045564,(ulong)pPVar13->type);
        if (iVar7 < 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"ERROR: ioctl error adding event type ",0x25);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
        }
        puVar5 = (pPVar13->codes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (puVar12 = (pPVar13->codes).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar12 != puVar5; puVar12 = puVar12 + 1) {
          uVar1 = *puVar12;
          uVar2 = pPVar13->type;
          if (uVar2 == 1) {
            __request = 0x40045565;
LAB_001025ea:
            bVar6 = false;
          }
          else {
            if (uVar2 == 3) {
              __request = 0x40045567;
              goto LAB_001025ea;
            }
            if (uVar2 == 2) {
              __request = 0x40045566;
              goto LAB_001025ea;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"ERROR: Unsupported event type ",0x1e);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            bVar6 = true;
            __request = 0;
          }
          if ((!bVar6) && (iVar7 = ioctl(this->_fd,__request,(ulong)uVar1), iVar7 < 0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"ERROR: ioctl error adding event code ",0x25);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            plVar11 = (long *)std::ostream::operator<<(poVar10,uVar1);
            std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
            std::ostream::put((char)plVar11);
            std::ostream::flush();
          }
        }
      }
      iVar7 = ioctl(this->_fd,0x5501);
      if (iVar7 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"ERROR: ioctl error creating device",0x22);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
      }
    }
    else {
      close(this->_fd);
      this->_fd = 0;
    }
  }
  return;
}

Assistant:

UinputDevice::UinputDevice(std::string const& path, unsigned int bus, std::string const& name, unsigned int vendor, unsigned int product, unsigned int version, std::vector<PossibleEvent> const& possibleEvents, std::vector<AbsoluteAxisCalibrationData> const& absoluteAxesCalibrationData)
{
  _fd = 0;
  open(path);
  if(_fd)
  {
    uinput_user_dev device;
    memset(&device,0,sizeof(device));
    strncpy(device.name, name.data(), UINPUT_MAX_NAME_SIZE);
    device.id.bustype = bus;
    device.id.product = product;
    device.id.vendor = vendor;
    device.id.version = version;

    for(AbsoluteAxisCalibrationData const& aacd : absoluteAxesCalibrationData) {
      device.absmin[aacd.axis] = aacd.min;
      device.absmax[aacd.axis] = aacd.max;
      device.absfuzz[aacd.axis] = aacd.fuzz;
      device.absflat[aacd.axis] = aacd.flat;
    }

    if(write(_fd, &device, sizeof(device)) != sizeof(device))
    {
      close(_fd);
      _fd = 0;
    }
    else
    {
      for(PossibleEvent const& pe : possibleEvents)
      {
        if(ioctl(_fd, UI_SET_EVBIT, pe.type) < 0)
        {
          std::cerr << "ERROR: ioctl error adding event type " << pe.type << std::endl;
        }

        for(int code : pe.codes)
        {
          unsigned int type = 0;
          switch(pe.type)
          {
            case EV_KEY: type = UI_SET_KEYBIT; break;
            case EV_REL: type = UI_SET_RELBIT; break;
            case EV_ABS: type = UI_SET_ABSBIT; break;
            default: std:: cerr << "ERROR: Unsupported event type " << pe.type << std::endl;
          }

          if(type && ioctl(_fd, type, code) < 0)
          {
            std::cerr << "ERROR: ioctl error adding event code " << pe.type << " " << code << std::endl;
          }
        }
      }

      if(ioctl(_fd, UI_DEV_CREATE) < 0)
      {
        std::cerr << "ERROR: ioctl error creating device" << std::endl;
      }
    }
  }
}